

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::verifyShaderSourceReplaced
          (ShaderSourceReplaceCase *this,Shader *shader,string *firstSource,string *secondSource)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  char *description;
  string result;
  string local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  readSource_abi_cxx11_(&local_1c8,this,shader);
  if (local_1c8._M_string_length == firstSource->_M_string_length) {
    if (local_1c8._M_string_length != 0) {
      iVar3 = bcmp(local_1c8._M_dataplus._M_p,(firstSource->_M_dataplus)._M_p,
                   local_1c8._M_string_length);
      if (iVar3 != 0) goto LAB_00ee71fe;
    }
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, source was not replaced.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    description = "Shader source nor replaced";
  }
  else {
LAB_00ee71fe:
    if (local_1c8._M_string_length == secondSource->_M_string_length) {
      if (local_1c8._M_string_length == 0) goto LAB_00ee72e6;
      iVar3 = bcmp(local_1c8._M_dataplus._M_p,(secondSource->_M_dataplus)._M_p,
                   local_1c8._M_string_length);
      if (iVar3 == 0) goto LAB_00ee72e6;
    }
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, invalid shader source.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    description = "Invalid source";
  }
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,description);
LAB_00ee72e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void verifyShaderSourceReplaced (glu::Shader& shader, const std::string& firstSource, const std::string& secondSource)
	{
		TestLog&			log		= m_testCtx.getLog();
		const std::string	result	= readSource(shader);

		if (result == firstSource)
		{
			log << TestLog::Message << "Fail, source was not replaced." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader source nor replaced");
		}
		else if (result != secondSource)
		{
			log << TestLog::Message << "Fail, invalid shader source." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid source");
		}
	}